

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::XThreadFulfiller<void>::reject(XThreadFulfiller<void> *this,Exception *exception)

{
  XThreadPaf *in_RAX;
  FulfillScope scope;
  FulfillScope local_18;
  
  local_18.obj = in_RAX;
  XThreadPaf::FulfillScope::FulfillScope(&local_18,&this->target);
  if (local_18.obj != (XThreadPaf *)0x0) {
    ExceptionOrValue::addException((ExceptionOrValue *)(local_18.obj + 1),exception);
  }
  XThreadPaf::FulfillScope::~FulfillScope(&local_18);
  return;
}

Assistant:

void reject(Exception&& exception) const override {
    XThreadPaf::FulfillScope scope(&target);
    if (scope.shouldFulfill()) {
      scope.getTarget<T>()->result.addException(kj::mv(exception));
    }
  }